

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ParseContext::ParseGroup
          (ParseContext *this,MessageLite *msg,char *ptr,uint32_t tag)

{
  long lVar1;
  string sVar2;
  anon_class_40_5_beb31822 add;
  anon_class_40_5_beb31822 add_00;
  anon_class_40_5_beb31822 add_01;
  char cVar3;
  uint32_t uVar4;
  char *pcVar5;
  string *extraout_RAX;
  char *pcVar6;
  string *psVar7;
  string *extraout_RAX_00;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  unsigned_long extraout_RDX_01;
  unsigned_long uVar8;
  RepeatedField<int> *unaff_RBX;
  uint uVar9;
  EpsCopyInputStream *this_00;
  code *unaff_R12;
  char *pcVar10;
  int iVar11;
  undefined8 unaff_R13;
  uint uVar12;
  InternalMetadata *unaff_R14;
  string *psVar13;
  ulong uVar14;
  pair<const_char_*,_int> pVar15;
  pair<const_char_*,_unsigned_long> pVar16;
  RepeatedField<int> *this_01;
  code *pcVar17;
  undefined8 uVar18;
  InternalMetadata *this_02;
  char *pcStack_90;
  undefined2 uStack_88;
  undefined6 uStack_86;
  undefined2 uStack_80;
  undefined8 uStack_7e;
  ulong uStack_68;
  char *pcStack_60;
  long lStack_58;
  ParseContext *pPStack_50;
  char *pcStack_48;
  char *pcStack_30;
  
  this_00 = (EpsCopyInputStream *)&stack0xffffffffffffffc8;
  iVar11 = this->depth_;
  lVar1 = (long)iVar11 + -1;
  this->depth_ = (int)lVar1;
  if ((long)iVar11 < 1) {
    pcVar10 = (char *)0x0;
  }
  else {
    pcVar10 = (char *)((long)this->group_depth_ + 1);
    this->group_depth_ = (int)pcVar10;
    pcVar5 = MessageLite::_InternalParse(msg,ptr,this);
    if (pcVar5 != (char *)0x0) {
      if ((int)lVar1 == this->depth_) {
        psVar13 = (string *)0x0;
      }
      else {
        psVar13 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                            (lVar1,(long)this->depth_,"old_depth == depth_");
      }
      if (psVar13 != (string *)0x0) {
        ParseGroup();
        psVar13 = extraout_RAX;
LAB_00268795:
        ParseGroup();
        sVar2 = *psVar13;
        uVar9 = (uint)(byte)sVar2;
        uStack_68 = (ulong)tag;
        pcStack_60 = pcVar10;
        lStack_58 = lVar1;
        pPStack_50 = this;
        pcStack_48 = pcVar5;
        if ((char)sVar2 < '\0') {
          pVar15 = ReadSizeFallback((char *)psVar13,(uint)(byte)sVar2);
          psVar13 = (string *)pVar15.first;
          uVar9 = pVar15.second;
        }
        else {
          psVar13 = psVar13 + 1;
        }
        if (psVar13 == (string *)0x0) {
LAB_0026891b:
          pcVar10 = (char *)0x0;
        }
        else {
          uVar4 = *(int *)&this_00->buffer_end_ - (int)psVar13;
          do {
            iVar11 = uVar9 - uVar4;
            if (iVar11 == 0 || (int)uVar9 < (int)uVar4) {
              add_01.is_valid = (EnumValidityFuncWithArg *)unaff_RBX;
              add_01.object = pcStack_30;
              add_01.data = unaff_R12;
              add_01.metadata = (InternalMetadata *)unaff_R13;
              add_01._32_8_ = unaff_R14;
              psVar7 = (string *)
                       ReadPackedVarintArray<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>
                                 ((char *)psVar13,(char *)(psVar13 + (int)uVar9),add_01);
              if (psVar13 + (int)uVar9 == psVar7) {
                return (char *)psVar7;
              }
              return (char *)0x0;
            }
            add.is_valid = (EnumValidityFuncWithArg *)unaff_RBX;
            add.object = pcStack_30;
            add.data = unaff_R12;
            add.metadata = (InternalMetadata *)unaff_R13;
            add._32_8_ = unaff_R14;
            this_01 = unaff_RBX;
            pcVar17 = unaff_R12;
            uVar18 = unaff_R13;
            this_02 = unaff_R14;
            psVar13 = (string *)
                      ReadPackedVarintArray<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>
                                ((char *)psVar13,this_00->buffer_end_,add);
            if (psVar13 == (string *)0x0) goto LAB_0026891b;
            pcVar5 = this_00->buffer_end_;
            uVar12 = (int)psVar13 - (int)pcVar5;
            if (0x10 < uVar12) {
              EpsCopyInputStream::
              ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_,google::protobuf::internal::EpsCopyInputStream::ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>(char_const*,google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_)::_lambda(int)_1_>
                        ((EpsCopyInputStream *)&pcStack_90);
              psVar7 = extraout_RAX_00;
LAB_00268978:
              psVar13 = (string *)&pcStack_90;
              EpsCopyInputStream::
              ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_,google::protobuf::internal::EpsCopyInputStream::ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>(char_const*,google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_)::_lambda(int)_1_>
                        ();
              uVar8 = extraout_RDX;
              while( true ) {
                if (psVar7 <= psVar13) {
                  return (char *)psVar13;
                }
                uVar14 = (ulong)(char)*psVar13;
                if ((long)uVar14 < 0) {
                  pVar16 = VarintParseSlow64((char *)psVar13,(uint)(byte)*psVar13);
                  uVar14 = pVar16.second;
                }
                else {
                  pVar16.second = uVar8;
                  pVar16.first = (char *)(psVar13 + 1);
                }
                psVar13 = (string *)pVar16.first;
                if (psVar13 == (string *)0x0) break;
                cVar3 = (*pcVar17)(uVar18,uVar14 & 0xffffffff);
                if (cVar3 == '\0') {
                  if ((this_02->ptr_ & 1U) == 0) {
                    s = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>(this_02)
                    ;
                  }
                  else {
                    s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((this_02->ptr_ & 0xfffffffffffffffeU) + 8);
                  }
                  WriteVarint(uVar4,(long)(int)uVar14,s);
                  uVar8 = extraout_RDX_01;
                }
                else {
                  RepeatedField<int>::Add(this_01,(int)uVar14);
                  uVar8 = extraout_RDX_00;
                }
                if (psVar13 == (string *)0x0) {
                  return (char *)0x0;
                }
              }
              return (char *)0x0;
            }
            if (iVar11 < 0x11) {
              uStack_80 = 0;
              uStack_7e = 0;
              pcStack_90 = *(char **)pcVar5;
              uStack_88 = (undefined2)*(undefined8 *)(pcVar5 + 8);
              uStack_86 = (undefined6)((ulong)*(undefined8 *)(pcVar5 + 8) >> 0x10);
              add_00.is_valid = (EnumValidityFuncWithArg *)unaff_RBX;
              add_00.object = pcStack_30;
              add_00.data = unaff_R12;
              add_00.metadata = (InternalMetadata *)unaff_R13;
              add_00._32_8_ = unaff_R14;
              pcVar6 = ReadPackedVarintArray<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>
                                 ((char *)((long)&pcStack_90 + (ulong)(uVar12 & 0x1f)),
                                  (char *)((long)&pcStack_90 + (long)iVar11),add_00);
              pcVar5 = (char *)0x0;
              pcVar10 = this_00->buffer_end_ + ((long)pcVar6 - (long)&pcStack_90);
              if (pcVar6 != (char *)((long)&pcStack_90 + (long)iVar11)) {
                pcVar10 = pcVar5;
              }
            }
            else {
              uVar9 = uVar9 - (uVar4 + uVar12);
              if ((int)uVar9 < 1) {
                psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                                   ((long)(int)uVar9,0,"size > 0");
              }
              else {
                psVar7 = (string *)0x0;
              }
              if (psVar7 != (string *)0x0) goto LAB_00268978;
              if ((this_00->limit_ < 0x11) ||
                 (psVar13 = (string *)EpsCopyInputStream::Next(this_00), psVar13 == (string *)0x0))
              {
                pcVar5 = (char *)0x0;
                pcVar10 = (char *)0x0;
              }
              else {
                psVar13 = psVar13 + (uVar12 & 0x1f);
                uVar4 = *(int *)&this_00->buffer_end_ - (int)psVar13;
                pcVar5 = (char *)0x1;
              }
            }
          } while ((char)pcVar5 != '\0');
        }
        return pcVar10;
      }
      if ((int)pcVar10 == this->group_depth_) {
        psVar13 = (string *)0x0;
      }
      else {
        psVar13 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                            ((long)pcVar10,(long)this->group_depth_,
                             "old_group_depth == group_depth_");
      }
      if (psVar13 != (string *)0x0) goto LAB_00268795;
    }
    this->group_depth_ = this->group_depth_ + -1;
    this->depth_ = this->depth_ + 1;
    uVar4 = (this->super_EpsCopyInputStream).last_tag_minus_1_;
    (this->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar10 = (char *)0x0;
    if (uVar4 == tag) {
      pcVar10 = pcVar5;
    }
  }
  return pcVar10;
}

Assistant:

PROTOBUF_NODISCARD PROTOBUF_NDEBUG_INLINE const char* ParseGroup(
      MessageLite* msg, const char* ptr, uint32_t tag) {
    if (--depth_ < 0) return nullptr;
    group_depth_++;
    auto old_depth = depth_;
    auto old_group_depth = group_depth_;
    ptr = msg->_InternalParse(ptr, this);
    if (ptr != nullptr) {
      ABSL_DCHECK_EQ(old_depth, depth_);
      ABSL_DCHECK_EQ(old_group_depth, group_depth_);
    }
    group_depth_--;
    depth_++;
    if (PROTOBUF_PREDICT_FALSE(!ConsumeEndGroup(tag))) return nullptr;
    return ptr;
  }